

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O0

IOTHUB_MESSAGE_LIST * get_next_event_to_send(AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device)

{
  PDLIST_ENTRY Entry;
  int iVar1;
  PDLIST_ENTRY list_entry;
  IOTHUB_MESSAGE_LIST *message;
  AMQP_TRANSPORT_DEVICE_INSTANCE *registered_device_local;
  
  iVar1 = DList_IsListEmpty(registered_device->waiting_to_send);
  if (iVar1 == 0) {
    Entry = registered_device->waiting_to_send->Flink;
    list_entry = (PDLIST_ENTRY)&Entry[-2].Blink;
    DList_RemoveEntryList(Entry);
  }
  else {
    list_entry = (PDLIST_ENTRY)0x0;
  }
  return (IOTHUB_MESSAGE_LIST *)list_entry;
}

Assistant:

static IOTHUB_MESSAGE_LIST* get_next_event_to_send(AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device)
{
    IOTHUB_MESSAGE_LIST* message;

    if (!DList_IsListEmpty(registered_device->waiting_to_send))
    {
        PDLIST_ENTRY list_entry = registered_device->waiting_to_send->Flink;
        message = containingRecord(list_entry, IOTHUB_MESSAGE_LIST, entry);
        (void)DList_RemoveEntryList(list_entry);
    }
    else
    {
        message = NULL;
    }

    return message;
}